

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O1

int __thiscall jrtplib::RTPSession::SendPacket(RTPSession *this,void *data,size_t len)

{
  int iVar1;
  size_t len_00;
  uint8_t *data_00;
  
  iVar1 = -0x3e;
  if ((this->created == true) &&
     (iVar1 = RTPPacketBuilder::BuildPacket(&this->packetbuilder,data,len), -1 < iVar1)) {
    if ((this->packetbuilder).init == false) {
      data_00 = (uint8_t *)0x0;
      len_00 = 0;
    }
    else {
      data_00 = (this->packetbuilder).buffer;
      len_00 = (this->packetbuilder).packetlength;
    }
    iVar1 = SendRTPData(this,data_00,len_00);
    if (-1 < iVar1) {
      RTPSources::SentRTPPacket(&(this->sources).super_RTPSources);
      this->sentpackets = true;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int RTPSession::SendPacket(const void *data,size_t len)
{
	int status;
	
	if (!created)
		return ERR_RTP_SESSION_NOTCREATED;

	BUILDER_LOCK
	if ((status = packetbuilder.BuildPacket(data,len)) < 0)
	{
		BUILDER_UNLOCK
		return status;
	}
	if ((status = SendRTPData(packetbuilder.GetPacket(),packetbuilder.GetPacketLength())) < 0)
	{
		BUILDER_UNLOCK
		return status;
	}
	BUILDER_UNLOCK

	SOURCES_LOCK
	sources.SentRTPPacket();
	SOURCES_UNLOCK
	PACKSENT_LOCK
	sentpackets = true;
	PACKSENT_UNLOCK
	return 0;
}